

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void ssh_bpp_common_setup(BinaryPacketProtocol *bpp)

{
  BinaryPacketProtocol *bpp_local;
  
  pq_in_init(&bpp->in_pq);
  pq_out_init(&bpp->out_pq);
  bpp->input_eof = false;
  (bpp->ic_in_raw).fn = ssh_bpp_input_raw_data_callback;
  (bpp->ic_in_raw).ctx = bpp;
  (bpp->ic_out_pq).fn = ssh_bpp_output_packet_callback;
  (bpp->ic_out_pq).ctx = bpp;
  (bpp->out_pq).pqb.ic = &bpp->ic_out_pq;
  return;
}

Assistant:

void ssh_bpp_common_setup(BinaryPacketProtocol *bpp)
{
    pq_in_init(&bpp->in_pq);
    pq_out_init(&bpp->out_pq);
    bpp->input_eof = false;
    bpp->ic_in_raw.fn = ssh_bpp_input_raw_data_callback;
    bpp->ic_in_raw.ctx = bpp;
    bpp->ic_out_pq.fn = ssh_bpp_output_packet_callback;
    bpp->ic_out_pq.ctx = bpp;
    bpp->out_pq.pqb.ic = &bpp->ic_out_pq;
}